

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

void __thiscall libchars::command_cursor::command_cursor(command_cursor *this,command_cursor *n)

{
  bool bVar1;
  command_node *pcVar2;
  command_cursor *n_local;
  command_cursor *this_local;
  
  std::
  stack<libchars::command_node*,std::deque<libchars::command_node*,std::allocator<libchars::command_node*>>>
  ::stack<std::deque<libchars::command_node*,std::allocator<libchars::command_node*>>,void>
            ((stack<libchars::command_node*,std::deque<libchars::command_node*,std::allocator<libchars::command_node*>>>
              *)this);
  std::__cxx11::string::string((string *)&this->w);
  pcVar2 = current(n);
  this->root = pcVar2;
  this->idx = 0;
  bVar1 = std::
          stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
          ::empty(&n->S);
  if (bVar1) {
    this->root_idx = n->root_idx + n->idx;
  }
  else {
    this->root_idx = n->idx;
  }
  return;
}

Assistant:

command_cursor::command_cursor(const command_cursor &n) :
        root(n.current()),idx(0)
    {
        if (n.S.empty())
            root_idx = n.root_idx + n.idx;
        else
            root_idx = n.idx;
    }